

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.h
# Opt level: O3

AssertionResult __thiscall
testing::internal::CmpHelperEQ<unsigned_int,unsigned_long>
          (internal *this,char *expected_expression,char *actual_expression,uint *expected,
          unsigned_long *actual)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *extraout_RDX;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *extraout_RDX_00;
  AssertionResult AVar2;
  String local_50;
  String local_40;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> sVar1
  ;
  
  if (*actual == (ulong)*expected) {
    AVar2 = AssertionSuccess();
    sVar1 = AVar2.message_.ptr_;
  }
  else {
    FormatForComparisonFailureMessage<unsigned_int,unsigned_long>
              ((uint *)&local_50,(unsigned_long *)expected);
    FormatForComparisonFailureMessage<unsigned_long,unsigned_int>
              ((unsigned_long *)&local_40,(uint *)actual);
    AVar2 = EqFailure(this,expected_expression,actual_expression,&local_50,&local_40,false);
    sVar1 = AVar2.message_.ptr_;
    if (local_40.c_str_ != (char *)0x0) {
      operator_delete__(local_40.c_str_);
      sVar1.ptr_ = extraout_RDX;
    }
    if (local_50.c_str_ != (char *)0x0) {
      operator_delete__(local_50.c_str_);
      sVar1.ptr_ = extraout_RDX_00;
    }
  }
  AVar2.message_.ptr_ = sVar1.ptr_;
  AVar2._0_8_ = this;
  return AVar2;
}

Assistant:

AssertionResult CmpHelperEQ(const char* expected_expression,
                            const char* actual_expression,
                            const T1& expected,
                            const T2& actual) {
#ifdef _MSC_VER
# pragma warning(push)          // Saves the current warning state.
# pragma warning(disable:4389)  // Temporarily disables warning on
                               // signed/unsigned mismatch.
#endif

  if (expected == actual) {
    return AssertionSuccess();
  }

#ifdef _MSC_VER
# pragma warning(pop)          // Restores the warning state.
#endif

  return EqFailure(expected_expression,
                   actual_expression,
                   FormatForComparisonFailureMessage(expected, actual),
                   FormatForComparisonFailureMessage(actual, expected),
                   false);
}